

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O1

void __thiscall
mp::SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>::
HandleSolution(SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>
               *this,int status,CStringRef message,double *values,double *dual_values,double param_5
              )

{
  int iVar1;
  MockProblemBuilder *this_00;
  long *plVar2;
  size_t sVar3;
  MultiObjTestSolver<2> *pMVar4;
  size_type sVar5;
  pointer pcVar6;
  char *pcVar7;
  Result RVar8;
  long lVar9;
  bool bVar10;
  Argument1 gmock_a1;
  Argument1 gmock_a1_00;
  Argument1 gmock_a1_01;
  Argument1 gmock_a1_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dir;
  string solFilePath;
  SolutionAdapter<MultiObjMockProblemBuilder> sol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  double *local_118;
  CStringRef local_110;
  undefined8 local_108;
  char local_100;
  undefined7 uStack_ff;
  char *local_f0;
  SolutionAdapter<MultiObjMockProblemBuilder> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar10 = true;
  if ((this->solver_->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
      count_solutions_ == false) {
    bVar10 = (this->solver_->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.
             super_BasicSolver.solution_stub_._M_string_length != 0;
  }
  local_118 = dual_values;
  local_f0 = message.data_;
  if ((values != (double *)0x0) && (bVar10)) {
    gmock_a1.size_ = 4;
    gmock_a1.data_ = "nsol";
    MockProblemBuilder::AddIntSuffix(&this->builder_->super_MockProblemBuilder,gmock_a1,0x53,0);
    gmock_a1_00.size_ = 4;
    gmock_a1_00.data_ = "nsol";
    MockProblemBuilder::AddIntSuffix(&this->builder_->super_MockProblemBuilder,gmock_a1_00,0x52,0);
    gmock_a1_01.size_ = 5;
    gmock_a1_01.data_ = "npool";
    MockProblemBuilder::AddIntSuffix(&this->builder_->super_MockProblemBuilder,gmock_a1_01,0x53,0);
    gmock_a1_02.size_ = 5;
    gmock_a1_02.data_ = "npool";
    MockProblemBuilder::AddIntSuffix(&this->builder_->super_MockProblemBuilder,gmock_a1_02,0x52,0);
  }
  this_00 = &this->builder_->super_MockProblemBuilder;
  plVar2 = (this->options_).data_;
  sVar3 = (this->options_).size_;
  if (values == (double *)0x0) {
    local_e8.values_.size_ = 0;
  }
  else {
    RVar8 = MockProblemBuilder::num_vars(this_00);
    local_e8.values_.size_ = (size_t)RVar8;
  }
  if (local_118 == (double *)0x0) {
    local_e8.dual_values_.size_ = 0;
  }
  else {
    RVar8 = MockProblemBuilder::num_algebraic_cons(&this->builder_->super_MockProblemBuilder);
    local_e8.dual_values_.size_ = (size_t)RVar8;
  }
  pMVar4 = this->solver_;
  if (((pMVar4->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
       opts_read_ != true) ||
     (local_e8.objno_ = 0,
     (pMVar4->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
     obj_added_ == true)) {
    iVar1 = (pMVar4->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
            objno_;
    local_e8.objno_ = -iVar1;
    if (0 < iVar1) {
      local_e8.objno_ = iVar1;
    }
  }
  local_e8.message_ = local_f0;
  local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.dual_values_.data_ = local_118;
  local_108 = 0;
  local_100 = '\0';
  sVar5 = (this->overrideStub_)._M_string_length;
  local_110.data_ = &local_100;
  local_e8.status_ = status;
  local_e8.builder_ = (MultiObjMockProblemBuilder *)this_00;
  local_e8.options_.data_ = plVar2;
  local_e8.options_.size_ = sVar3;
  local_e8.values_.data_ = values;
  if (sVar5 == 0) {
    pcVar6 = (this->stub_)._M_dataplus._M_p;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,pcVar6,pcVar6 + (this->stub_)._M_string_length);
    std::__cxx11::string::append((char *)&local_138);
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_001c5907;
  }
  else {
    if ((sVar5 != 1) &&
       ((pcVar7 = (this->overrideStub_)._M_dataplus._M_p, *pcVar7 == '/' || (pcVar7[1] == ':')))) {
      std::__cxx11::string::_M_assign((string *)&local_110);
      goto LAB_001c5907;
    }
    lVar9 = std::__cxx11::string::find_last_of((char *)&this->stub_,0x21c47a,0xffffffffffffffff);
    if (lVar9 == -1) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
    }
    else {
      std::__cxx11::string::substr((ulong)&local_138,(ulong)&this->stub_);
    }
    std::operator+(&local_50,&local_138,&this->overrideStub_);
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_001c5907;
  }
  operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
LAB_001c5907:
  WriteSolFile<mp::SolutionAdapter<MultiObjMockProblemBuilder>>(local_110,&local_e8);
  if (local_110.data_ != &local_100) {
    operator_delete(local_110.data_,CONCAT71(uStack_ff,local_100) + 1);
  }
  if (local_e8.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.dual_values_.save_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.dual_values_.save_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.values_.save_.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.options_.save_.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SolutionWriterImpl<Solver, PB, Writer>::HandleSolution(
    int status, fmt::CStringRef message, const double *values,
    const double *dual_values, double) {
	if (solver_.need_multiple_solutions()
			&& values) {             // not when reporting an error
    auto kindP = mp::suf::Kind( suf::PROBLEM | suf::OUTPUT | suf::OUTONLY );
    auto kindO = mp::suf::Kind( suf::OBJ | suf::OUTPUT | suf::OUTONLY );
    builder_.AddIntSuffix("nsol", kindP, 0).
        SetValue(0, num_solutions_);
    builder_.AddIntSuffix("nsol", kindO, 0).
        SetValue(0, num_solutions_);
    builder_.AddIntSuffix("npool", kindP, 0).
        SetValue(0, num_solutions_);
    builder_.AddIntSuffix("npool", kindO, 0).
        SetValue(0, num_solutions_);
  }
  SolutionAdapter<PB> sol(
        status, &builder_, message.c_str(), options_,
        MakeArrayRef(values, values ? builder_.num_vars() : 0),
        MakeArrayRef(dual_values,
                     dual_values ? builder_.num_algebraic_cons() : 0),
        solver_.objno_used());

  std::string solFilePath;
  if (!overrideStub_.empty()) { 
    // Check if its absolute or relative
    if ((overrideStub_.length() >= 2) &&// cannot be absolute otherwise 
       ((overrideStub_[0] == '/') || // linux abs (/ ...)
        (overrideStub_[1] == ':') ))  {// windows abs (x: ///)
        solFilePath = overrideStub_; // if absolute
    }
    else { // if relative
      size_t pos = stub_.find_last_of("\\/"); //.find parent dir
      auto dir = (std::string::npos == pos) ? "" : stub_.substr(0, pos+1);
      solFilePath = dir + overrideStub_;
    }
  }
  else { solFilePath = stub_ + ".sol"; }
  
  this->Write(solFilePath, sol);
}